

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O2

double __thiscall
Trainer::Trainer<Kuhn::Game>::CFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  long lVar1;
  bool bVar2;
  uint actionNum;
  int iVar3;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *pdVar5;
  ulong uVar6;
  int a;
  uint action;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dStack_100;
  undefined1 local_f8 [8];
  Game game_cp;
  string infoSet;
  double local_38;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  dStack_100 = 5.52382190282472e-318;
  bVar2 = Kuhn::Game::done(game);
  if (!bVar2) {
    dStack_100 = 5.52400470711368e-318;
    actionNum = Kuhn::Game::actionNum(game);
    dStack_100 = 5.52405905433473e-318;
    bVar2 = Kuhn::Game::isChanceNode(game);
    if (bVar2) {
      action = 0;
      if ((int)actionNum < 1) {
        actionNum = 0;
      }
      local_38 = 0.0;
      for (; actionNum != action; action = action + 1) {
        dStack_100 = 5.52437031569161e-318;
        Kuhn::Game::Game((Game *)local_f8,game);
        dStack_100 = 5.52441972225619e-318;
        Kuhn::Game::step((Game *)local_f8,action);
        dStack_100 = 5.52445924750786e-318;
        dVar8 = Kuhn::Game::chanceProbability((Game *)local_f8);
        dStack_100 = 5.52462228917099e-318;
        dVar9 = CFR(this,(Game *)local_f8,playerIndex,pi,dVar8 * po);
        local_38 = local_38 + dVar9 * dVar8;
      }
    }
    else {
      dStack_100 = 5.5248100341164e-318;
      Kuhn::Game::infoSetStr_abi_cxx11_((string *)(game_cp.mInfoSets[1] + 9),game);
      dStack_100 = 5.52484955936807e-318;
      iVar3 = Kuhn::Game::currentPlayer(game);
      if (this->mUpdate[iVar3] == false) {
        uVar7 = 0;
        uVar6 = (ulong)actionNum;
        if ((int)actionNum < 1) {
          uVar6 = uVar7;
        }
        local_38 = 0.0;
        for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          dStack_100 = 5.52661337372373e-318;
          Kuhn::Game::Game((Game *)local_f8,game);
          dStack_100 = 5.52666772094477e-318;
          Kuhn::Game::step((Game *)local_f8,(int)uVar7);
          dStack_100 = 5.52678629669977e-318;
          ppNVar4 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(this->mFixedStrategies + iVar3),(key_type *)(game_cp.mInfoSets[1] + 9))
          ;
          dStack_100 = 5.52682582195144e-318;
          pdVar5 = Node::averageStrategy(*ppNVar4);
          dVar8 = pdVar5[uVar7];
          dStack_100 = 5.52699874492748e-318;
          dVar9 = CFR(this,(Game *)local_f8,playerIndex,pi,dVar8 * po);
          local_38 = local_38 + dVar8 * dVar9;
        }
      }
      else {
        dStack_100 = 5.52507682956516e-318;
        ppNVar4 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->mNodeMap,(key_type *)(game_cp.mInfoSets[1] + 9));
        this_00 = *ppNVar4;
        if (this_00 == (mapped_type)0x0) {
          dStack_100 = 5.52515588006849e-318;
          this_00 = (mapped_type)operator_new(0x30);
          dStack_100 = 5.52522998991537e-318;
          Node::Node(this_00,actionNum);
          dStack_100 = 5.52530409976225e-318;
          ppNVar4 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->mNodeMap,(key_type *)(game_cp.mInfoSets[1] + 9));
          *ppNVar4 = this_00;
        }
        dStack_100 = 5.52538315026558e-318;
        pdVar5 = Node::strategy(this_00);
        lVar1 = -((ulong)actionNum * 8 + 0xf & 0xfffffffffffffff0);
        uVar7 = 0;
        uVar6 = (ulong)actionNum;
        if ((int)actionNum < 1) {
          uVar6 = uVar7;
        }
        local_38 = 0.0;
        for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          *(undefined8 *)(local_f8 + lVar1 + -8) = 0x1110e4;
          Kuhn::Game::Game((Game *)local_f8,game);
          *(undefined8 *)(local_f8 + lVar1 + -8) = 0x1110ee;
          Kuhn::Game::step((Game *)local_f8,(int)uVar7);
          if (iVar3 == playerIndex) {
            dVar8 = pdVar5[uVar7] * pi;
            dVar9 = po;
          }
          else {
            dVar8 = pi;
            dVar9 = pdVar5[uVar7] * po;
          }
          *(undefined8 *)(local_f8 + lVar1 + -8) = 0x111125;
          dVar8 = CFR(this,(Game *)local_f8,playerIndex,dVar8,dVar9);
          *(double *)(local_f8 + uVar7 * 8 + lVar1 + -0xf8 + 0xf8) = dVar8;
          local_38 = local_38 + dVar8 * pdVar5[uVar7];
        }
        if (iVar3 == playerIndex) {
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            dVar8 = *(double *)(local_f8 + uVar7 * 8 + lVar1 + -0xf8 + 0xf8);
            *(undefined8 *)(local_f8 + lVar1 + -8) = 0x11121e;
            dVar9 = Node::regretSum(this_00,(int)uVar7);
            *(undefined8 *)(local_f8 + lVar1 + -8) = 0x11123f;
            Node::regretSum(this_00,(int)uVar7,(dVar8 - local_38) * po + dVar9);
          }
          *(undefined8 *)(local_f8 + lVar1 + -8) = 0x111256;
          Node::strategySum(this_00,pdVar5,pi);
        }
      }
      dStack_100 = 5.52771514011395e-318;
      std::__cxx11::string::~string((string *)(game_cp.mInfoSets[1] + 9));
    }
    return local_38;
  }
  dVar8 = Kuhn::Game::payoff(game,playerIndex);
  return dVar8;
}

Assistant:

double Trainer<T>::CFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // chance node turn
    const int actionNum = game.actionNum();
    if (game.isChanceNode()) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const double chanceProbability = game_cp.chanceProbability();
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const auto chanceProbability = double(mFixedStrategies[player].at(infoSet)->averageStrategy()[a]);
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call CFR with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = CFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = CFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}